

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof.cpp
# Opt level: O0

void __thiscall tst_internals_argsof::lambda(tst_internals_argsof *this)

{
  anon_class_1_0_00000001 lMutable;
  anon_class_1_0_00000001 lManyArgs;
  anon_class_1_0_00000001 lOneArg;
  anon_class_1_0_00000001 lNoArg;
  tst_internals_argsof *this_local;
  
  return;
}

Assistant:

void tst_internals_argsof::lambda()
{
    auto lNoArg = []() {};
    auto lOneArg = [](float) {};
    auto lManyArgs = [](const float&, int, char**) {};
    auto lMutable = [](const float&, int, char**) mutable {};

    TEST_ARGS_FOR_TYPE(decltype(lNoArg), void);
    TEST_ARGS_FOR_TYPE(decltype(lOneArg), float);
    TEST_ARGS_FOR_TYPE(decltype(lManyArgs), const float&);
    TEST_ARGS_FOR_TYPE(decltype(lMutable), const float&);
}